

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

RISCVCPU * cpu_riscv_init_riscv32(uc_struct_conflict12 *uc)

{
  uint32_t *puVar1;
  _Bool _Var2;
  char *str1;
  byte bVar3;
  int iVar4;
  RISCVCPU *cs;
  byte bVar5;
  uint uVar6;
  RISCVCPU *cpu;
  target_ulong_conflict tVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  
  cs = (RISCVCPU *)calloc(1,0x9190);
  if (cs == (RISCVCPU *)0x0) {
    return (RISCVCPU *)0x0;
  }
  if (uc->cpu_model == 0x7fffffff) {
    uc->cpu_model = 3;
  }
  else if (3 < (uint)uc->cpu_model) {
    free(cs);
    return (RISCVCPU *)0x0;
  }
  (cs->parent_obj).cc = &(cs->cc).parent_class;
  (cs->parent_obj).uc = (uc_struct_conflict10 *)uc;
  uc->cpu = (CPUState_conflict *)cs;
  cpu_class_init((uc_struct *)uc,&(cs->cc).parent_class);
  (cs->cc).parent_reset = (cs->cc).parent_class.reset;
  (cs->cc).parent_class.reset = riscv_cpu_reset;
  (cs->cc).parent_class.has_work = riscv_cpu_has_work;
  (cs->cc).parent_class.do_interrupt = riscv_cpu_do_interrupt_riscv32;
  (cs->cc).parent_class.cpu_exec_interrupt = riscv_cpu_exec_interrupt_riscv32;
  (cs->cc).parent_class.set_pc = riscv_cpu_set_pc;
  (cs->cc).parent_class.synchronize_from_tb = riscv_cpu_synchronize_from_tb;
  (cs->cc).parent_class.do_unaligned_access = riscv_cpu_do_unaligned_access_riscv32;
  (cs->cc).parent_class.tcg_initialize = riscv_translate_init_riscv32;
  (cs->cc).parent_class.tlb_fill_cpu = riscv_cpu_tlb_fill_riscv32;
  (cs->cfg).ext_i = true;
  (cs->cfg).ext_e = false;
  (cs->cfg).ext_g = true;
  (cs->cfg).ext_m = true;
  (cs->cfg).ext_a = true;
  (cs->cfg).ext_f = true;
  (cs->cfg).ext_d = true;
  (cs->cfg).ext_c = true;
  (cs->cfg).ext_s = true;
  (cs->cfg).ext_u = true;
  (cs->cfg).ext_h = false;
  (cs->cfg).ext_counters = true;
  (cs->cfg).ext_ifencei = true;
  (cs->cfg).ext_icsr = true;
  (cs->cfg).priv_spec = "v1.11.0";
  (cs->cfg).mmu = true;
  (cs->cfg).pmp = true;
  cpu_common_initfn((uc_struct *)uc,(CPUState *)cs);
  (cs->env).uc = uc;
  (cs->parent_obj).env_ptr = &cs->env;
  (cs->parent_obj).icount_decr_ptr = &(cs->neg).icount_decr;
  (*cpu_models[uc->cpu_model].initfn)((CPUState_conflict *)cs);
  cpu_exec_realizefn_riscv32((CPUState_conflict *)cs);
  str1 = (cs->cfg).priv_spec;
  tVar7 = 0x11100;
  if ((str1 != (char *)0x0) && (iVar4 = g_strcmp0(str1,"v1.11.0"), iVar4 != 0)) {
    iVar4 = g_strcmp0((cs->cfg).priv_spec,"v1.10.0");
    if (iVar4 == 0) {
      tVar7 = 0x11000;
    }
    else {
      iVar4 = g_strcmp0((cs->cfg).priv_spec,"v1.9.1");
      if (iVar4 != 0) goto LAB_00c1d8fb;
      tVar7 = 0x10901;
    }
  }
  (cs->env).priv_ver = tVar7;
  (cs->env).resetvec = 0x1000;
  if ((cs->cfg).mmu == true) {
    puVar1 = &(cs->env).features;
    *(byte *)puVar1 = (byte)*puVar1 | 1;
  }
  if ((cs->cfg).pmp == true) {
    puVar1 = &(cs->env).features;
    *(byte *)puVar1 = (byte)*puVar1 | 2;
  }
  if ((cs->env).misa == 0) {
    bVar10 = (cs->cfg).ext_i;
    _Var2 = (cs->cfg).ext_e;
    if ((_Bool)bVar10 == _Var2) goto LAB_00c1d8fb;
    bVar9 = (cs->cfg).ext_m;
    bVar8 = (cs->cfg).ext_a;
    bVar5 = (cs->cfg).ext_f;
    bVar3 = (cs->cfg).ext_d;
    if (((cs->cfg).ext_g == true) && ((bVar8 & bVar5 & bVar9 & bVar10 & bVar3) == 0)) {
      (cs->cfg).ext_i = true;
      (cs->cfg).ext_m = true;
      (cs->cfg).ext_a = true;
      (cs->cfg).ext_f = true;
      (cs->cfg).ext_d = true;
      bVar3 = 1;
      bVar5 = 1;
      bVar8 = 1;
      bVar9 = 1;
      bVar10 = 1;
    }
    uVar11 = (uint)bVar10 * 0x100 + 0x10;
    if (_Var2 == false) {
      uVar11 = (uint)bVar10 * 0x100;
    }
    uVar6 = uVar11 + 0x1000;
    if ((bVar9 & 1) == 0) {
      uVar6 = uVar11;
    }
    uVar11 = bVar8 | uVar6 | 0x20;
    if ((bVar5 & 1) == 0) {
      uVar11 = bVar8 | uVar6;
    }
    uVar6 = uVar11 | 8;
    if ((bVar3 & 1) == 0) {
      uVar6 = uVar11;
    }
    uVar11 = uVar6 | 4;
    if ((cs->cfg).ext_c == false) {
      uVar11 = uVar6;
    }
    uVar6 = uVar11 | 0x40000;
    if ((cs->cfg).ext_s == false) {
      uVar6 = uVar11;
    }
    uVar11 = uVar6 | 0x100000;
    if ((cs->cfg).ext_u == false) {
      uVar11 = uVar6;
    }
    uVar6 = uVar11 | 0x80;
    if ((cs->cfg).ext_h == false) {
      uVar6 = uVar11;
    }
    (cs->env).misa = uVar6 | 0x40000000;
    (cs->env).misa_mask = uVar6 | 0x40000000;
  }
  cpu_reset((CPUState *)cs);
LAB_00c1d8fb:
  cpu_address_space_init_riscv32
            ((CPUState_conflict *)cs,0,(MemoryRegion_conflict *)(cs->parent_obj).memory);
  qemu_init_vcpu_riscv32((CPUState_conflict *)cs);
  return cs;
}

Assistant:

RISCVCPU *cpu_riscv_init(struct uc_struct *uc)
{
    RISCVCPU *cpu;
    CPUState *cs;
    CPUClass *cc;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

#ifdef TARGET_RISCV32
    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_RISCV32_SIFIVE_U34;
    }
#else
    /* TARGET_RISCV64 */
    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_RISCV64_SIFIVE_U54;
    }
#endif

    if (uc->cpu_model >= ARRAY_SIZE(cpu_models)) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = (CPUState *)cpu;

    /* init CPUClass */
    cpu_class_init(uc, cc);

    /* init RISCVCPUClass */
    riscv_cpu_class_init(uc, cc, NULL);

    /* init device properties*/
    cpu->cfg.ext_i = true;
    cpu->cfg.ext_e = false;
    cpu->cfg.ext_g = true;
    cpu->cfg.ext_m = true;
    cpu->cfg.ext_a = true;
    cpu->cfg.ext_f = true;
    cpu->cfg.ext_d = true;
    cpu->cfg.ext_c = true;
    cpu->cfg.ext_s = true;
    cpu->cfg.ext_u = true;
    cpu->cfg.ext_h = false;
    cpu->cfg.ext_counters = true;
    cpu->cfg.ext_ifencei = true;
    cpu->cfg.ext_icsr = true;
    cpu->cfg.priv_spec = "v1.11.0";
    cpu->cfg.mmu = true;
    cpu->cfg.pmp = true;

    /* init CPUState */
    cpu_common_initfn(uc, cs);

    /* init CPU */
    riscv_cpu_init(uc, cs);

    /* init specific CPU model */
    cpu_models[uc->cpu_model].initfn(cs);

    /* realize CPU */
    riscv_cpu_realize(uc, cs);

    // init addresss space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    return cpu;
}